

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  int total;
  int pp;
  Arguments args;
  FileDataSource input;
  int local_150 [2];
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  _Any_data local_128;
  code *local_118;
  undefined8 uStack_110;
  Arguments local_108;
  undefined1 local_98 [40];
  undefined2 local_70;
  UFILE *local_38;
  
  paVar1 = &local_108.type.field_2;
  local_108.type._M_string_length = 0;
  local_108.type.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_108.inputFile.field_2;
  local_108.inputFile._M_string_length = 0;
  local_108.inputFile.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_108.codepage.field_2;
  local_108.codepage._M_string_length = 0;
  local_108.codepage.field_2._M_local_buf[0] = '\0';
  local_108.type._M_dataplus._M_p = (pointer)paVar1;
  local_108.inputFile._M_dataplus._M_p = (pointer)paVar2;
  local_108.codepage._M_dataplus._M_p = (pointer)paVar3;
  bVar4 = handle_command_args(argc,argv,&local_108);
  iVar5 = -1;
  if (bVar4) {
    local_98[8] = true;
    local_98[9] = true;
    local_98[10] = false;
    local_98._12_8_ = 0x2c;
    local_98._20_4_ = 0;
    local_98._32_8_ = ucsdet_getLanguage_70;
    local_70 = 2;
    local_98._0_8_ = &PTR__FileDataSource_0011db18;
    local_38 = (UFILE *)0x0;
    _Var6._M_p = (pointer)local_108.codepage._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.codepage._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      _Var6._M_p = local_108.codepage._M_dataplus._M_p;
    }
    iVar5 = csv::icu::FileDataSource::open
                      ((FileDataSource *)local_98,local_108.inputFile._M_dataplus._M_p,
                       (int)_Var6._M_p);
    if ((char)iVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to open file",0x13);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(-1);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_108);
    bVar4 = local_108.verbose;
    if (iVar5 == 0) {
      local_98._12_4_ = 9;
    }
    if (local_108.separator != 0x2c) {
      local_98._12_4_ = (int)local_108.separator;
    }
    local_150[1] = 0xffffffff;
    local_150[0] = 0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = (code *)0x0;
    uStack_110 = 0;
    local_148._M_unused._M_object = (void *)0x0;
    local_148._8_8_ = 0;
    local_138 = (code *)0x0;
    pcStack_130 = (code *)0x0;
    local_148._M_unused._M_object = operator_new(0x20);
    *(int **)local_148._M_unused._0_8_ = local_150 + 1;
    *(bool *)((long)local_148._M_unused._0_8_ + 8) = bVar4;
    *(size_t *)((long)local_148._M_unused._0_8_ + 0x10) = local_108.limit;
    *(int **)((long)local_148._M_unused._0_8_ + 0x18) = local_150;
    pcStack_130 = std::
                  _Function_handler<bool_(const_csv::record_&,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/tools/csv_command_line/main.cpp:63:21)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<bool_(const_csv::record_&,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/tools/csv_command_line/main.cpp:63:21)>
                ::_M_manager;
    csv::parse((IDataSource *)local_98,(FieldCallback *)&local_128,(RecordCallback *)&local_148);
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    if ((code)local_108.verbose == (code)0x1) {
      anon_unknown.dwarf_39f0::PrintProgress(1.0,(long)local_150[0]);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    csv::icu::FileDataSource::~FileDataSource((FileDataSource *)local_98);
    iVar5 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.codepage._M_dataplus._M_p != paVar3) {
    operator_delete(local_108.codepage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.inputFile._M_dataplus._M_p != paVar2) {
    operator_delete(local_108.inputFile._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.type._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.type._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

int main(int argc, const char * argv[]) {

	// Wrap everything in a try block.  Do this every time,
	// because exceptions will be thrown for problems.
	Arguments args;
	if (handle_command_args(argc, argv, args) == false) {
		return -1;
	}

	csv::icu::FileDataSource input;
	if (!input.open(args.inputFile.c_str(), args.codepage.length() > 0 ? args.codepage.c_str() : NULL)) {
		cerr << "Unable to open file" << endl;
		exit(-1);
	}

	if (args.type == "tsv") {
		input.separator = '\t';
	}

	if (args.separator != ',') {
		input.separator = args.separator;
	}

	int pp = -1;
	int total = 0;

	bool verbose = args.verbose;
	size_t limit = args.limit;

	auto recordAdder = [&pp, verbose, limit, &total](const csv::record& record, double complete) -> bool {

		if (total > 0) {
			cout << "\n";
		}

		total += 1;
		if (verbose && (int)(complete*100) != pp) {
			pp = (int)(complete*100);
			PrintProgress(complete, record.row);
		}

		bool lineStarted = false;
		for (const auto& field : record.content) {
			if (lineStarted) {
				lineStarted = true;
				cout << "\t";
			}
			std::string fieldValue = field.content;
			ReplaceStringInPlace(fieldValue, "\"", "\"\"");
			cout << "\"" << fieldValue << "\"\t";
		}

		if (limit > 0 && record.row == limit - 1) {
			PrintProgress(1.0, record.row + 1);
			return false;
		}

		// Only flush every 1000 records
		if ((total % 10000) == 0) {
			cout << flush;
		}

		return true;
	};
	csv::parse(input, NULL, recordAdder);

	if (args.verbose) {
		PrintProgress(1, total);
		cerr << endl;
	}

	return 0;
}